

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O2

void test_format<char>(string *charset)

{
  int iVar1;
  uint uVar2;
  undefined1 __format [8];
  __type _Var3;
  bool bVar4;
  basic_format<char> *pbVar5;
  ostream *poVar6;
  tm *__tp;
  runtime_error *prVar7;
  size_t in_RCX;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  void *__buf_32;
  void *__buf_33;
  void *__buf_34;
  void *__buf_35;
  void *__buf_36;
  void *__buf_37;
  void *__buf_38;
  void *__buf_39;
  void *__buf_40;
  void *__buf_41;
  void *__buf_42;
  void *__buf_43;
  void *__buf_44;
  void *__buf_45;
  void *__buf_46;
  void *__buf_47;
  void *__buf_48;
  void *__buf_49;
  void *__buf_50;
  void *__buf_51;
  void *__buf_52;
  void *__buf_53;
  void *__buf_54;
  void *__buf_55;
  void *__buf_56;
  void *__buf_57;
  void *__buf_58;
  void *__buf_59;
  void *__buf_60;
  void *__buf_61;
  void *__buf_62;
  void *__buf_63;
  void *__buf_64;
  void *__buf_65;
  void *__buf_66;
  void *__buf_67;
  void *__buf_68;
  string_type local_14a0;
  string_type local_1480;
  string_type local_1460;
  string_type local_1440;
  string_type local_1420;
  string_type local_1400;
  string_type local_13e0;
  string_type local_13c0;
  string_type local_13a0;
  string_type local_1380;
  string_type local_1360;
  string_type local_1340;
  string_type local_1320;
  string_type local_1300;
  string_type local_12e0;
  string_type local_12c0;
  string_type local_12a0;
  string_type local_1280;
  string_type local_1260;
  string_type local_1240;
  string_type local_1220;
  string_type local_1200;
  string_type local_11e0;
  string_type local_11c0;
  string_type local_11a0;
  string_type local_1180;
  string_type local_1160;
  string_type local_1140;
  string_type local_1120;
  string_type local_1100;
  string_type local_10e0;
  string_type local_10c0;
  string_type local_10a0;
  string_type local_1080;
  string_type local_1060;
  string_type local_1040;
  string_type local_1020;
  string_type local_1000;
  string_type local_fe0;
  string_type local_fc0;
  string_type local_fa0;
  string_type local_f80;
  string_type local_f60;
  string_type local_f40;
  string_type local_f20;
  string_type local_f00;
  string_type local_ee0;
  string_type local_ec0;
  string_type local_ea0;
  string_type local_e80;
  string_type local_e60;
  string_type local_e40;
  string_type local_e20;
  string_type local_e00;
  string_type local_de0;
  string_type local_dc0;
  string_type local_da0;
  string_type local_d80;
  string_type local_d60;
  string_type local_d40;
  string_type local_d20;
  string_type local_d00;
  string_type local_ce0;
  string_type local_cc0;
  string_type local_ca0;
  string_type local_c80;
  string_type local_c60;
  string_type local_c40;
  string_type local_c20;
  string_type local_c00;
  locale local_be0 [8];
  locale local_bd8 [8];
  locale local_bd0 [8];
  locale local_bc8 [8];
  locale local_bc0 [8];
  locale local_bb8 [8];
  locale local_bb0 [8];
  locale local_ba8 [8];
  locale local_ba0 [8];
  locale local_b98 [8];
  locale local_b90 [8];
  locale local_b88 [8];
  locale local_b80 [8];
  locale local_b78 [8];
  locale local_b70 [8];
  locale local_b68 [8];
  locale local_b60 [8];
  locale local_b58 [8];
  locale local_b50 [8];
  locale local_b48 [8];
  locale local_b40 [8];
  long local_b38;
  time_t lnow;
  locale local_b28 [8];
  locale local_b20 [8];
  locale local_b18 [8];
  locale local_b10 [8];
  locale local_b08 [8];
  locale local_b00 [8];
  locale local_af8 [8];
  locale local_af0 [8];
  locale local_ae8 [8];
  locale local_ae0 [8];
  locale local_ad8 [8];
  locale local_ad0 [8];
  locale local_ac8 [8];
  string *local_ac0;
  locale local_ab8 [8];
  locale local_ab0 [8];
  locale local_aa8 [8];
  locale local_aa0 [8];
  locale local_a98 [8];
  locale local_a90 [8];
  locale local_a88 [8];
  locale local_a80 [8];
  locale local_a78 [8];
  locale local_a70 [8];
  locale local_a68 [8];
  locale local_a60 [8];
  locale local_a58 [8];
  locale local_a50 [8];
  locale local_a48 [8];
  locale local_a40 [8];
  locale local_a38 [8];
  locale local_a30 [8];
  locale local_a28 [8];
  locale local_a20 [8];
  locale local_a18 [8];
  locale local_a10 [8];
  locale local_a08 [8];
  locale local_a00 [8];
  locale local_9f8 [8];
  locale local_9f0 [8];
  locale local_9e8 [8];
  locale local_9e0 [8];
  locale local_9d8 [8];
  locale local_9d0 [8];
  locale local_9c8 [8];
  locale local_9c0 [8];
  locale local_9b8 [8];
  locale local_9b0 [8];
  locale local_9a8 [8];
  locale local_9a0 [8];
  locale local_998 [8];
  locale local_990 [8];
  locale local_988 [8];
  locale local_980 [8];
  locale local_978 [8];
  locale local_970 [8];
  locale local_968 [8];
  locale local_960 [8];
  locale local_958 [8];
  locale local_950 [8];
  locale local_948 [8];
  locale local_940 [8];
  locale local_938 [8];
  locale local_930 [8];
  locale local_928 [8];
  locale local_920 [8];
  locale local_918 [8];
  locale local_910 [8];
  locale local_908 [8];
  locale local_900 [8];
  locale local_8f8 [8];
  locale local_8f0 [8];
  locale local_8e8 [8];
  locale local_8e0 [8];
  locale local_8d8 [8];
  locale local_8d0 [8];
  locale local_8c8 [8];
  locale local_8c0 [8];
  locale local_8b8 [8];
  locale local_8b0 [8];
  locale local_8a8 [8];
  locale local_8a0 [8];
  locale local_898 [8];
  locale local_890 [8];
  locale local_888 [8];
  locale local_880 [8];
  locale local_878 [8];
  locale local_870 [8];
  locale local_868 [8];
  locale local_860 [8];
  locale local_858 [8];
  locale local_850 [8];
  locale local_848 [8];
  locale local_840 [8];
  locale local_838 [8];
  locale local_830 [8];
  locale local_828 [8];
  locale local_820 [8];
  locale local_818 [8];
  locale local_810 [8];
  locale local_808 [8];
  locale local_800 [8];
  locale local_7f8 [8];
  locale local_7f0 [8];
  locale local_7e8 [8];
  locale local_7e0 [8];
  locale local_7d8 [8];
  locale local_7d0 [8];
  locale local_7c8 [8];
  locale local_7c0 [8];
  locale local_7b8 [8];
  locale local_7b0 [8];
  locale local_7a8 [8];
  locale local_7a0 [8];
  locale local_798 [8];
  locale local_790 [8];
  locale local_788 [8];
  locale local_780 [8];
  locale local_778 [8];
  locale local_770 [8];
  locale local_768 [8];
  locale local_760 [8];
  locale local_758 [8];
  locale local_750 [8];
  locale local_748 [8];
  locale local_740 [8];
  locale local_738 [8];
  locale local_730 [8];
  locale local_728 [8];
  locale local_720 [8];
  locale local_718 [8];
  locale local_710 [8];
  locale local_708 [8];
  locale local_700 [8];
  locale local_6f8 [8];
  locale local_6f0 [8];
  locale local_6e8 [8];
  locale local_6e0 [8];
  locale local_6d8 [8];
  locale local_6d0 [8];
  locale local_6c8 [8];
  locale local_6c0 [8];
  locale local_6b8 [8];
  locale local_6b0 [8];
  locale local_6a8 [8];
  locale local_6a0 [8];
  locale local_698 [8];
  locale local_690 [8];
  locale local_688 [8];
  locale local_680 [8];
  locale local_678 [8];
  locale local_670 [8];
  locale local_668 [8];
  locale local_660 [8];
  locale local_658 [8];
  locale local_650 [8];
  locale local_648 [8];
  locale local_640 [8];
  locale local_638 [8];
  locale local_630 [8];
  locale local_628 [8];
  locale local_620 [8];
  locale local_618 [8];
  locale local_610 [8];
  locale local_608 [8];
  locale local_600 [8];
  locale local_5f8 [8];
  locale local_5f0 [8];
  locale local_5e8 [8];
  locale local_5e0 [8];
  locale local_5d8 [8];
  locale local_5d0 [8];
  locale local_5c8 [8];
  locale local_5c0 [8];
  locale local_5b8 [8];
  locale local_5b0 [8];
  locale local_5a8 [8];
  locale local_5a0 [8];
  locale local_598 [8];
  locale local_590 [8];
  locale local_588 [8];
  locale local_580 [8];
  locale local_578 [8];
  locale local_570 [8];
  locale local_568 [8];
  locale local_560 [8];
  locale local_558 [8];
  locale local_550 [8];
  locale local_548 [8];
  generator local_540 [8];
  generator g;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  time_t local_3c0;
  time_t now;
  char local_time_str [256];
  string local_2b0;
  undefined1 local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fmt_21;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> format_string;
  time_t a_datetime;
  undefined1 local_60 [8];
  string format;
  string local_38 [8];
  locale loc;
  
  booster::locale::generator::generator(local_540);
  local_ac0 = charset;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,"en_US.",
                 charset);
  booster::locale::generator::generate(local_38);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_be0);
  std::locale::~locale(local_be0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{3} {1} {2}",(allocator *)&now);
  std::locale::locale(local_ab8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_ab8);
  std::locale::~locale(local_ab8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_14a0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_14a0);
  now = CONCAT44(now._4_4_,1);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  local_60._0_4_ = 2;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_60);
  local_a8._0_4_ = 3;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_a8);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf,in_RCX);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_14a0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"3 1 2",(allocator *)local_a8);
  std::locale::locale(local_ab0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_ab0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_ab0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"3 1 2\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_aa8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_aa8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_aa8);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  local_a8._0_4_ = 2;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_a8);
  local_210._0_4_ = 3;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_210);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_00,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"3 1 2",(allocator *)local_a8);
  std::locale::locale(local_aa0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_aa0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_aa0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"3 1 2\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1480,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1480);
  local_210._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  a_datetime._0_4_ = 2;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)&a_datetime);
  local_2b0._M_dataplus._M_p._0_4_ = 3;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)&local_2b0);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"3 1 2",(allocator *)&local_3c0);
  std::locale::locale(local_a98,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_a98);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_a98);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1480);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c5);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1 % 2 % 3).str(loc))==(to_correct_string<CharType>(\"3 1 2\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bd8);
  std::locale::~locale(local_bd8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1} {2}",(allocator *)&now);
  std::locale::locale(local_a90,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_a90);
  std::locale::~locale(local_a90);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1460,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1460);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(char (*) [6])"hello");
  now = CONCAT44(now._4_4_,2);
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_01,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1460);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"hello 2",(allocator *)local_a8);
  std::locale::locale(local_a88,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a88);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a88);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"hello 2\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_a80,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_a80);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_a80);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(char (*) [6])"hello");
  local_60._0_4_ = 2;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_02,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"hello 2",(allocator *)local_a8);
  std::locale::locale(local_a78,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a78);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a78);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"hello 2\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1440,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1440);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(char (*) [6])"hello");
  local_210._0_4_ = 2;
  pbVar5 = booster::locale::basic_format<char>::operator%(pbVar5,(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"hello 2",(allocator *)&a_datetime);
  std::locale::locale(local_a70,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_a70);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_a70);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1440);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c6);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % \"hello\" % 2).str(loc))==(to_correct_string<CharType>(\"hello 2\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bd0);
  std::locale::~locale(local_bd0);
  std::__cxx11::string::string((string *)(fmt_21.field_2._M_local_buf + 8),"{1}",(allocator *)&now);
  std::locale::locale(local_a68,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_a68);
  std::locale::~locale(local_a68);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1420,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1420);
  now = 0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_03,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1420);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1200.1",(allocator *)local_a8);
  std::locale::locale(local_a60,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a60);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c7);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_a58,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_a58);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_a58);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_04,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1200.1",(allocator *)local_a8);
  std::locale::locale(local_a50,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a50);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a50);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c7);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1400,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1400);
  local_210 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"1200.1",(allocator *)&a_datetime);
  std::locale::locale(local_a48,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_a48);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_a48);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1400);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c7);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1200.1).str(loc))==(to_correct_string<CharType>(\"1200.1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bc8);
  std::locale::~locale(local_bc8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"Test {1,num}",(allocator *)&now);
  std::locale::locale(local_a40,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_a40);
  std::locale::~locale(local_a40);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_13e0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_13e0);
  now = 0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_05,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_13e0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"Test 1,200.1",(allocator *)local_a8);
  std::locale::locale(local_a38,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a38);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a38);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c8);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"Test 1,200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_a30,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_a30);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_a30);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_06,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"Test 1,200.1",(allocator *)local_a8);
  std::locale::locale(local_a28,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a28);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a28);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c8);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"Test 1,200.1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_13c0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_13c0);
  local_210 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"Test 1,200.1",(allocator *)&a_datetime);
  std::locale::locale(local_a20,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_a20);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_a20);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_13c0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c8);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1200.1).str(loc))==(to_correct_string<CharType>(\"Test 1,200.1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bc0);
  std::locale::~locale(local_bc0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{{}} {1,number}",(allocator *)&now);
  std::locale::locale(local_a18,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_a18);
  std::locale::~locale(local_a18);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_13a0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_13a0);
  now = 0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_07,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_13a0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"{} 1,200.1",(allocator *)local_a8);
  std::locale::locale(local_a10,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a10);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a10);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c9);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"{} 1,200.1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_a08,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_a08);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_a08);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_08,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"{} 1,200.1",(allocator *)local_a8);
  std::locale::locale(local_a00,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_a00);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_a00);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c9);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"{} 1,200.1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1380,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1380);
  local_210 = (undefined1  [8])0x4092c06666666666;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"{} 1,200.1",(allocator *)&a_datetime);
  std::locale::locale(local_9f8,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_9f8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_9f8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1380);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1c9);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1200.1).str(loc))==(to_correct_string<CharType>(\"{} 1,200.1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bb8);
  std::locale::~locale(local_bb8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,num=fix,p=3}",(allocator *)&now);
  std::locale::locale(local_9f0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_9f0);
  std::locale::~locale(local_9f0);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1360,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1360);
  now = 0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_09,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1360);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"13.100",(allocator *)local_a8);
  std::locale::locale(local_9e8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_9e8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_9e8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1cf);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_9e0,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_9e0);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_9e0);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_10,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"13.100",(allocator *)local_a8);
  std::locale::locale(local_9d8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_9d8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_9d8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1cf);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1340,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1340);
  local_210 = (undefined1  [8])0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"13.100",(allocator *)&a_datetime);
  std::locale::locale(local_9d0,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_9d0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_9d0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1340);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1cf);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 13.1).str(loc))==(to_correct_string<CharType>(\"13.100\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_bb0);
  std::locale::~locale(local_bb0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,num=fixed,p=3}",(allocator *)&now);
  std::locale::locale(local_9c8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_9c8);
  std::locale::~locale(local_9c8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1320,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1320);
  now = 0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_11,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1320);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"13.100",(allocator *)local_a8);
  std::locale::locale(local_9c0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_9c0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_9c0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d0);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_9b8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_9b8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_9b8);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_12,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"13.100",(allocator *)local_a8);
  std::locale::locale(local_9b0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_9b0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_9b0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d0);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13.100\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1300,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1300);
  local_210 = (undefined1  [8])0x402a333333333333;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"13.100",(allocator *)&a_datetime);
  std::locale::locale(local_9a8,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_9a8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_9a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1300);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d0);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 13.1).str(loc))==(to_correct_string<CharType>(\"13.100\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ba8);
  std::locale::~locale(local_ba8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,<,w=3,num}",(allocator *)&now);
  std::locale::locale(local_9a0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_9a0);
  std::locale::~locale(local_9a0);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_12e0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_12e0);
  now = CONCAT44(now._4_4_,0xffffffff);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_13,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_12e0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"-1 ",(allocator *)local_a8);
  std::locale::locale(local_998,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_998);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_998);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d1);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"-1 \",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_990,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_990);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_990);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0xffffffff;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_14,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"-1 ",(allocator *)local_a8);
  std::locale::locale(local_988,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_988);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_988);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d1);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"-1 \",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_12c0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_12c0);
  local_210._0_4_ = 0xffffffff;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"-1 ",(allocator *)&a_datetime);
  std::locale::locale(local_980,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_980);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_980);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_12c0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d1);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % -1).str(loc))==(to_correct_string<CharType>(\"-1 \",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ba0);
  std::locale::~locale(local_ba0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,>,w=3,num}",(allocator *)&now);
  std::locale::locale(local_978,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_978);
  std::locale::~locale(local_978);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_12a0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_12a0);
  now = CONCAT44(now._4_4_,1);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_15,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_12a0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"  1",(allocator *)local_a8);
  std::locale::locale(local_970,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_970);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_970);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d2);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"  1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_968,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_968);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_968);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_16,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"  1",(allocator *)local_a8);
  std::locale::locale(local_960,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_960);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_960);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d2);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"  1\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1280,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1280);
  local_210._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"  1",(allocator *)&a_datetime);
  std::locale::locale(local_958,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_958);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_958);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1280);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d2);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1).str(loc))==(to_correct_string<CharType>(\"  1\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b98);
  std::locale::~locale(local_b98);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{per,1}",(allocator *)&now);
  std::locale::locale(local_950,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_950);
  std::locale::~locale(local_950);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1260,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1260);
  now = 0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_17,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1260);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"10%",(allocator *)local_a8);
  std::locale::locale(local_948,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_948);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_948);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d3);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_940,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_940);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_940);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_18,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"10%",(allocator *)local_a8);
  std::locale::locale(local_938,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_938);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_938);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d3);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1240,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1240);
  local_210 = (undefined1  [8])0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"10%",(allocator *)&a_datetime);
  std::locale::locale(local_930,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_930);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_930);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1240);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d3);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 0.1).str(loc))==(to_correct_string<CharType>(\"10%\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b90);
  std::locale::~locale(local_b90);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{percent,1}",(allocator *)&now);
  std::locale::locale(local_928,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_928);
  std::locale::~locale(local_928);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1220,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1220);
  now = 0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_19,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1220);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"10%",(allocator *)local_a8);
  std::locale::locale(local_920,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_920);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_920);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d4);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_918,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_918);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_918);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60 = (undefined1  [8])0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_20,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"10%",(allocator *)local_a8);
  std::locale::locale(local_910,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_910);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_910);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d4);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"10%\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1200,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1200);
  local_210 = (undefined1  [8])0x3fb999999999999a;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(double *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"10%",(allocator *)&a_datetime);
  std::locale::locale(local_908,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_908);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_908);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1200);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d4);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 0.1).str(loc))==(to_correct_string<CharType>(\"10%\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b88);
  std::locale::~locale(local_b88);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,cur}",(allocator *)&now);
  std::locale::locale(local_900,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_900);
  std::locale::~locale(local_900);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_11e0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_11e0);
  now = CONCAT44(now._4_4_,0x4d2);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_21,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_11e0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_8f8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_8f8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_8f8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_8f0,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_8f0);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_8f0);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_22,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_8e8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_8e8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_8e8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_11c0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_11c0);
  local_210._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"$1,234.00",(allocator *)&a_datetime);
  std::locale::locale(local_8e0,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_8e0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_8e0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_11c0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d5);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1234).str(loc))==(to_correct_string<CharType>(\"$1,234.00\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b80);
  std::locale::~locale(local_b80);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,currency}",(allocator *)&now);
  std::locale::locale(local_8d8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_8d8);
  std::locale::~locale(local_8d8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_11a0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_11a0);
  now = CONCAT44(now._4_4_,0x4d2);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_23,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_11a0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_8d0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_8d0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_8d0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_8c8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_8c8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_8c8);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_24,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_8c0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_8c0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_8c0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1180,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1180);
  local_210._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"$1,234.00",(allocator *)&a_datetime);
  std::locale::locale(local_8b8,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_8b8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_8b8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1180);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d6);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1234).str(loc))==(to_correct_string<CharType>(\"$1,234.00\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  bVar4 = std::operator==(local_ac0,"UTF-8");
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
    std::ios::imbue(local_b78);
    std::locale::~locale(local_b78);
    std::__cxx11::string::string
              ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,cur,locale=de_DE}",(allocator *)&now)
    ;
    std::locale::locale(local_8b0,(locale *)local_38);
    to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_8b0);
    std::locale::~locale(local_8b0);
    std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_1160,(string *)local_290);
    booster::locale::basic_format<char>::basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1160);
    now = CONCAT44(now._4_4_,10);
    pbVar5 = booster::locale::basic_format<char>::operator%
                       ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
    booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_25,(size_t)pcVar8);
    booster::locale::basic_format<char>::~basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_1160);
    test_counter = test_counter + 1;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)local_60,anon_var_dwarf_7a1d,(allocator *)local_a8);
    std::locale::locale(local_8a8,(locale *)local_38);
    to_correct_string<char>((string *)&now,(string *)local_60,local_8a8);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (fmt_21.field_2._M_local_buf + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &now);
    std::__cxx11::string::~string((string *)&now);
    std::locale::~locale(local_8a8);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
    if (!_Var3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d9);
      poVar6 = std::operator<<(poVar6,anon_var_dwarf_7a2a);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar1 = error_counter + 1;
      bVar4 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar4) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)(fmt_21.field_2._M_local_buf + 8),
                   "Error limits reached, stopping unit test",(allocator *)&now);
        booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
    std::locale::locale(local_8a0,(locale *)local_38);
    to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_8a0);
    std::__cxx11::stringbuf::str((string *)&ss);
    std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
    std::locale::~locale(local_8a0);
    std::__cxx11::string::~string((string *)&now);
    now = now & 0xffffffff00000000;
    local_time_str[8] = '\0';
    local_time_str[9] = '\0';
    local_time_str[10] = '\0';
    local_time_str[0xb] = '\0';
    local_time_str[0xc] = '\0';
    local_time_str[0xd] = '\0';
    local_time_str[0xe] = '\0';
    local_time_str[0xf] = '\0';
    local_time_str[0x10] = '\0';
    local_time_str[0x11] = '\0';
    local_time_str[0x12] = '\0';
    local_time_str[0x13] = '\0';
    local_time_str[0x14] = '\0';
    local_time_str[0x15] = '\0';
    local_time_str[0x16] = '\0';
    local_time_str[0x17] = '\0';
    local_time_str._24_8_ = local_time_str + 0x28;
    local_time_str[0x20] = '\0';
    local_time_str[0x21] = '\0';
    local_time_str[0x22] = '\0';
    local_time_str[0x23] = '\0';
    local_time_str[0x24] = '\0';
    local_time_str[0x25] = '\0';
    local_time_str[0x26] = '\0';
    local_time_str[0x27] = '\0';
    local_time_str[0x28] = '\0';
    local_time_str._56_8_ = local_time_str + 0x48;
    local_time_str[0x40] = '\0';
    local_time_str[0x41] = '\0';
    local_time_str[0x42] = '\0';
    local_time_str[0x43] = '\0';
    local_time_str[0x44] = '\0';
    local_time_str[0x45] = '\0';
    local_time_str[0x46] = '\0';
    local_time_str[0x47] = '\0';
    local_time_str[0x48] = '\0';
    pcVar8 = local_time_str + 0x68;
    local_time_str[0x60] = '\0';
    local_time_str[0x61] = '\0';
    local_time_str[0x62] = '\0';
    local_time_str[99] = '\0';
    local_time_str[100] = '\0';
    local_time_str[0x65] = '\0';
    local_time_str[0x66] = '\0';
    local_time_str[0x67] = '\0';
    local_time_str[0x68] = '\0';
    local_time_str._88_8_ = pcVar8;
    booster::locale::basic_format<char>::basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
    local_60._0_4_ = 10;
    pbVar5 = booster::locale::basic_format<char>::operator%
                       ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
    booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_26,(size_t)pcVar8);
    booster::locale::basic_format<char>::~basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
    booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
    test_counter = test_counter + 1;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)local_60,anon_var_dwarf_7a1d,(allocator *)local_a8);
    std::locale::locale(local_898,(locale *)local_38);
    to_correct_string<char>((string *)&now,(string *)local_60,local_898);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (fmt_21.field_2._M_local_buf + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &now);
    std::__cxx11::string::~string((string *)&now);
    std::locale::~locale(local_898);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
    if (!_Var3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d9);
      poVar6 = std::operator<<(poVar6,anon_var_dwarf_7a2a);
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar2 = error_counter + 1;
      pcVar8 = (char *)(ulong)uVar2;
      bVar4 = 0x14 < error_counter;
      error_counter = uVar2;
      if (bVar4) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)(fmt_21.field_2._M_local_buf + 8),
                   "Error limits reached, stopping unit test",(allocator *)&now);
        booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    std::__cxx11::string::string((string *)&local_1140,(string *)local_290);
    booster::locale::basic_format<char>::basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1140);
    local_210._0_4_ = 10;
    pbVar5 = booster::locale::basic_format<char>::operator%
                       ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
    booster::locale::basic_format<char>::str_abi_cxx11_
              ((string_type *)&now,pbVar5,(locale *)local_38);
    std::__cxx11::string::string((string *)local_a8,anon_var_dwarf_7a1d,(allocator *)&a_datetime);
    std::locale::locale(local_890,(locale *)local_38);
    to_correct_string<char>((string *)local_60,(string *)local_a8,local_890);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &now,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::locale::~locale(local_890);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&now);
    booster::locale::basic_format<char>::~basic_format
              ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_1140);
    if (!_Var3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d9);
      poVar6 = std::operator<<(poVar6,anon_var_dwarf_7a37);
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar2 = error_counter + 1;
      pcVar8 = (char *)(ulong)uVar2;
      bVar4 = 0x14 < error_counter;
      error_counter = uVar2;
      if (bVar4) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)(fmt_21.field_2._M_local_buf + 8),
                   "Error limits reached, stopping unit test",(allocator *)&now);
        booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b70);
  std::locale::~locale(local_b70);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,cur=nat}",(allocator *)&now);
  std::locale::locale(local_888,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_888);
  std::locale::~locale(local_888);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1120,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1120);
  now = CONCAT44(now._4_4_,0x4d2);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_27,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1120);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_880,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_880);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_880);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1de);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_878,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_878);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_878);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_28,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_870,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_870);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_870);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1de);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1100,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1100);
  local_210._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"$1,234.00",(allocator *)&a_datetime);
  std::locale::locale(local_868,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_868);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_868);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1100);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1de);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1234).str(loc))==(to_correct_string<CharType>(\"$1,234.00\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b68);
  std::locale::~locale(local_b68);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,cur=national}",(allocator *)&now);
  std::locale::locale(local_860,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_860);
  std::locale::~locale(local_860);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_10e0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_10e0);
  now = CONCAT44(now._4_4_,0x4d2);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_29,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_10e0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_858,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_858);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_858);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1df);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_850,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_850);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_850);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_30,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"$1,234.00",(allocator *)local_a8);
  std::locale::locale(local_848,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_848);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_848);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1df);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"$1,234.00\",loc))")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_10c0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_10c0);
  local_210._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"$1,234.00",(allocator *)&a_datetime);
  std::locale::locale(local_840,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_840);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_840);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_10c0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1df);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1234).str(loc))==(to_correct_string<CharType>(\"$1,234.00\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b60);
  std::locale::~locale(local_b60);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,cur=iso}",(allocator *)&now);
  std::locale::locale(local_838,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_838);
  std::locale::~locale(local_838);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_10a0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_10a0);
  now = CONCAT44(now._4_4_,0x4d2);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_31,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_10a0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"USD1,234.00",(allocator *)local_a8);
  std::locale::locale(local_830,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_830);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_830);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e0);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"USD1,234.00\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_828,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_828);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_828);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_32,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"USD1,234.00",(allocator *)local_a8);
  std::locale::locale(local_820,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_820);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_820);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e0);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"USD1,234.00\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1080,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1080);
  local_210._0_4_ = 0x4d2;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"USD1,234.00",(allocator *)&a_datetime);
  std::locale::locale(local_818,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_818);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_818);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1080);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e0);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1234).str(loc))==(to_correct_string<CharType>(\"USD1,234.00\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b58);
  std::locale::~locale(local_b58);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,spell}",(allocator *)&now);
  std::locale::locale(local_810,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_810);
  std::locale::~locale(local_810);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1060,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1060);
  now = CONCAT44(now._4_4_,10);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_33,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1060);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"ten",(allocator *)local_a8);
  std::locale::locale(local_808,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_808);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_808);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e2);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_800,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_800);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_800);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 10;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_34,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"ten",(allocator *)local_a8);
  std::locale::locale(local_7f8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_7f8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_7f8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e2);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1040,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1040);
  local_210._0_4_ = 10;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"ten",(allocator *)&a_datetime);
  std::locale::locale(local_7f0,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_7f0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_7f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1040);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e2);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 10).str(loc))==(to_correct_string<CharType>(\"ten\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b50);
  std::locale::~locale(local_b50);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,spellout}",(allocator *)&now);
  std::locale::locale(local_7e8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_7e8);
  std::locale::~locale(local_7e8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_1020,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1020);
  now = CONCAT44(now._4_4_,10);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_35,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1020);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"ten",(allocator *)local_a8);
  std::locale::locale(local_7e0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_7e0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_7e0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e3);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_7d8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_7d8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_7d8);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 10;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_36,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"ten",(allocator *)local_a8);
  std::locale::locale(local_7d0,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_7d0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_7d0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e3);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"ten\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_1000,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_1000);
  local_210._0_4_ = 10;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"ten",(allocator *)&a_datetime);
  std::locale::locale(local_7c8,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_7c8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_7c8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_1000);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e3);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 10).str(loc))==(to_correct_string<CharType>(\"ten\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b48);
  std::locale::~locale(local_b48);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,ord}",(allocator *)&now);
  std::locale::locale(local_7c0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_7c0);
  std::locale::~locale(local_7c0);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_fe0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_fe0);
  now = CONCAT44(now._4_4_,1);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_37,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_fe0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1st",(allocator *)local_a8);
  std::locale::locale(local_7b8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_7b8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_7b8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ea);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_7b0,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_7b0);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_7b0);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_38,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1st",(allocator *)local_a8);
  std::locale::locale(local_7a8,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_7a8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_7a8);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ea);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_fc0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_fc0);
  local_210._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"1st",(allocator *)&a_datetime);
  std::locale::locale(local_7a0,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_7a0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_7a0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_fc0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ea);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1).str(loc))==(to_correct_string<CharType>(\"1st\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    pcVar8 = (char *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b40);
  std::locale::~locale(local_b40);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,ordinal}",(allocator *)&now);
  std::locale::locale(local_798,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)((long)&fmt_21.field_2 + 8),local_798);
  std::locale::~locale(local_798);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_fa0,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_fa0);
  now = CONCAT44(now._4_4_,1);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)&now);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_39,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_fa0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1st",(allocator *)local_a8);
  std::locale::locale(local_790,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_790);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_790);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1eb);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&now,"",(allocator *)local_60);
  std::locale::locale(local_788,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)&now,local_788);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_788);
  std::__cxx11::string::~string((string *)&now);
  now = now & 0xffffffff00000000;
  local_time_str[8] = '\0';
  local_time_str[9] = '\0';
  local_time_str[10] = '\0';
  local_time_str[0xb] = '\0';
  local_time_str[0xc] = '\0';
  local_time_str[0xd] = '\0';
  local_time_str[0xe] = '\0';
  local_time_str[0xf] = '\0';
  local_time_str[0x10] = '\0';
  local_time_str[0x11] = '\0';
  local_time_str[0x12] = '\0';
  local_time_str[0x13] = '\0';
  local_time_str[0x14] = '\0';
  local_time_str[0x15] = '\0';
  local_time_str[0x16] = '\0';
  local_time_str[0x17] = '\0';
  local_time_str._24_8_ = local_time_str + 0x28;
  local_time_str[0x20] = '\0';
  local_time_str[0x21] = '\0';
  local_time_str[0x22] = '\0';
  local_time_str[0x23] = '\0';
  local_time_str[0x24] = '\0';
  local_time_str[0x25] = '\0';
  local_time_str[0x26] = '\0';
  local_time_str[0x27] = '\0';
  local_time_str[0x28] = '\0';
  local_time_str._56_8_ = local_time_str + 0x48;
  local_time_str[0x40] = '\0';
  local_time_str[0x41] = '\0';
  local_time_str[0x42] = '\0';
  local_time_str[0x43] = '\0';
  local_time_str[0x44] = '\0';
  local_time_str[0x45] = '\0';
  local_time_str[0x46] = '\0';
  local_time_str[0x47] = '\0';
  local_time_str[0x48] = '\0';
  pcVar8 = local_time_str + 0x68;
  local_time_str[0x60] = '\0';
  local_time_str[0x61] = '\0';
  local_time_str[0x62] = '\0';
  local_time_str[99] = '\0';
  local_time_str[100] = '\0';
  local_time_str[0x65] = '\0';
  local_time_str[0x66] = '\0';
  local_time_str[0x67] = '\0';
  local_time_str[0x68] = '\0';
  local_time_str._88_8_ = pcVar8;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)&now);
  local_60._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_60);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_40,(size_t)pcVar8);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)&now);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)local_60,"1st",(allocator *)local_a8);
  std::locale::locale(local_780,(locale *)local_38);
  to_correct_string<char>((string *)&now,(string *)local_60,local_780);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now)
  ;
  std::__cxx11::string::~string((string *)&now);
  std::locale::~locale(local_780);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1eb);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"1st\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_f80,(string *)local_290);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_f80);
  local_210._0_4_ = 1;
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(int *)local_210);
  booster::locale::basic_format<char>::str_abi_cxx11_((string_type *)&now,pbVar5,(locale *)local_38)
  ;
  std::__cxx11::string::string((string *)local_a8,"1st",(allocator *)&a_datetime);
  std::locale::locale(local_778,(locale *)local_38);
  to_correct_string<char>((string *)local_60,(string *)local_a8,local_778);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&now,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale(local_778);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&now);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_f80);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1eb);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % 1).str(loc))==(to_correct_string<CharType>(\"1st\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)&now);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  local_3c0 = time((time_t *)0x0);
  local_b38 = local_3c0 + 0x3840;
  std::__cxx11::string::string((string *)local_60,"\'%H:%M:%S\'",(allocator *)&g);
  local_a8 = (undefined1  [8])&format_string._M_string_length;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_a8,local_60,format._M_dataplus._M_p + (long)local_60);
  __format = local_60;
  __tp = gmtime(&local_b38);
  strftime((char *)&now,0x100,(char *)__format,__tp);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue((locale *)&lnow);
  std::locale::~locale((locale *)&lnow);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,ftime=\'\'\'%H:%M:%S\'\'\'}",
             (allocator *)local_290);
  std::locale::locale(local_770,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_770);
  std::locale::~locale(local_770);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_f60,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_f60);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_41,(size_t)__tp);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_f60);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_768,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_768);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_768);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_760,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_760);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_760);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_42,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_758,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_758);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_758);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f5);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_f40,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_f40);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,(char *)&now,(allocator *)(format_string.field_2._M_local_buf + 8)
            );
  std::locale::locale(local_750,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_750);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_750);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_f40);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f5);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % now).str(loc))==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b28);
  std::locale::~locale(local_b28);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,local,ftime=\'\'\'%H:%M:%S\'\'\'}",
             (allocator *)local_290);
  std::locale::locale(local_748,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_748);
  std::locale::~locale(local_748);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_f20,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_f20);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_43,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_f20);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_740,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_740);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_740);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_738,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_738);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_738);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_44,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_730,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_730);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_730);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f6);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_f00,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_f00);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,(char *)&now,(allocator *)(format_string.field_2._M_local_buf + 8)
            );
  std::locale::locale(local_728,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_728);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_728);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_f00);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f6);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % now).str(loc))==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b20);
  std::locale::~locale(local_b20);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,ftime=\'\'\'%H:%M:%S\'\'\'}",
             (allocator *)local_290);
  std::locale::locale(local_720,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_720);
  std::locale::~locale(local_720);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_ee0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_ee0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_45,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_ee0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_718,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_718);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_718);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f7);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_710,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_710);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_710);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_46,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,(char *)&now,(allocator *)&local_2b0);
  std::locale::locale(local_708,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_708);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_708);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f7);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_ec0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_ec0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_3c0);
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,(char *)&now,(allocator *)(format_string.field_2._M_local_buf + 8)
            );
  std::locale::locale(local_700,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_700);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_700);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_ec0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f7);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % now).str(loc))==(to_correct_string<CharType>(local_time_str,loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  format_string.field_2._8_8_ = 0x2eff39;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b18);
  std::locale::~locale(local_b18);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),
             "{1,date,gmt};{1,time,gmt};{1,datetime,gmt};{1,dt,gmt}",(allocator *)local_290);
  std::locale::locale(local_6f8,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_6f8);
  std::locale::~locale(local_6f8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_ea0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_ea0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_47,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_ea0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,
             "Feb 5, 1970;3:33:13 PM;Feb 5, 1970, 3:33:13 PM;Feb 5, 1970, 3:33:13 PM",
             (allocator *)&local_2b0);
  std::locale::locale(local_6f0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_6f0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_6f0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fe);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970;3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_6e8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_6e8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_6e8);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_48,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,
             "Feb 5, 1970;3:33:13 PM;Feb 5, 1970, 3:33:13 PM;Feb 5, 1970, 3:33:13 PM",
             (allocator *)&local_2b0);
  std::locale::locale(local_6e0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_6e0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_6e0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fe);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"Feb 5, 1970;3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_e80,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_e80);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,
             "Feb 5, 1970;3:33:13 PM;Feb 5, 1970, 3:33:13 PM;Feb 5, 1970, 3:33:13 PM",
             (allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_6d8,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_6d8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_6d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_e80);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fe);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"Feb 5, 1970;3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM;Feb 5, 1970\" \",\" \" 3:33:13 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b10);
  std::locale::~locale(local_b10);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),
             "{1,time=short,gmt};{1,time=medium,gmt};{1,time=long,gmt};{1,date=full,gmt}",
             (allocator *)local_290);
  std::locale::locale(local_6d0,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_6d0);
  std::locale::~locale(local_6d0);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_e60,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_e60);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_49,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_e60);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)&local_2b0);
  std::locale::locale(local_6c8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_6c8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_6c8);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x201);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_6c0,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_6c0);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_6c0);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_50,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)&local_2b0);
  std::locale::locale(local_6b8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_6b8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_6b8);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x201);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_e40,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_e40);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_6b0,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_6b0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_6b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_e40);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x201);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b08);
  std::locale::~locale(local_b08);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),
             "{1,time=s,gmt};{1,time=m,gmt};{1,time=l,gmt};{1,date=f,gmt}",(allocator *)local_290);
  std::locale::locale(local_6a8,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_6a8);
  std::locale::~locale(local_6a8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_e20,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_e20);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_51,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_e20);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)&local_2b0);
  std::locale::locale(local_6a0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_6a0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_6a0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x203);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_698,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_698);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_698);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_52,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&a_datetime,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)&local_2b0);
  std::locale::locale(local_690,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_690);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_690);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x203);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_e00,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_e00);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970",
             (allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_688,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_688);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_688);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_e00);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x203);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_b00);
  std::locale::~locale(local_b00);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,time=s,tz=GMT+01:00}",
             (allocator *)local_290);
  std::locale::locale(local_680,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_680);
  std::locale::~locale(local_680);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_de0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_de0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_53,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_de0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"4:33 PM",(allocator *)&local_2b0);
  std::locale::locale(local_678,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_678);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_678);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20a);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_670,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_670);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_670);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_54,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"4:33 PM",(allocator *)&local_2b0);
  std::locale::locale(local_668,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_668);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_668);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20a);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_dc0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_dc0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"4:33 PM",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_660,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_660);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_660);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_dc0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20a);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"4:33 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_af8);
  std::locale::~locale(local_af8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,time=s,timezone=GMT+01:00}",
             (allocator *)local_290);
  std::locale::locale(local_658,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_658);
  std::locale::~locale(local_658);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_da0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_da0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_55,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_da0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"4:33 PM",(allocator *)&local_2b0);
  std::locale::locale(local_650,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_650);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_650);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20b);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_648,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_648);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_648);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_56,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"4:33 PM",(allocator *)&local_2b0);
  std::locale::locale(local_640,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_640);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_640);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20b);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"4:33 PM\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_d80,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_d80);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"4:33 PM",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_638,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_638);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_638);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d80);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20b);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"4:33 PM\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_af0);
  std::locale::~locale(local_af0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'%H\'\'\'}",
             (allocator *)local_290);
  std::locale::locale(local_630,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_630);
  std::locale::~locale(local_630);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_d60,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_d60);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_57,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d60);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"15\'",(allocator *)&local_2b0);
  std::locale::locale(local_628,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_628);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_628);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20d);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"15\'\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_620,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_620);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_620);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_58,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"15\'",(allocator *)&local_2b0);
  std::locale::locale(local_618,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_618);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_618);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20d);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"15\'\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_d40,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_d40);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"15\'",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_610,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_610);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_610);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d40);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20d);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"15\'\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ae8);
  std::locale::~locale(local_ae8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'\'\'%H\'}",
             (allocator *)local_290);
  std::locale::locale(local_608,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_608);
  std::locale::~locale(local_608);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_d20,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_d20);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_59,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d20);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"\'15",(allocator *)&local_2b0);
  std::locale::locale(local_600,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_600);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_600);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20e);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"\'15\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_5f8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_5f8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_5f8);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_60,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"\'15",(allocator *)&local_2b0);
  std::locale::locale(local_5f0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_5f0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_5f0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20e);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"\'15\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_d00,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_d00);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"\'15",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_5e8,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_5e8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_5e8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_d00);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20e);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"\'15\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ae0);
  std::locale::~locale(local_ae0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'%H o\'\'clock\'}",
             (allocator *)local_290);
  std::locale::locale(local_5e0,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_5e0);
  std::locale::~locale(local_5e0);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_ce0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_ce0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_61,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_ce0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"15 o\'clock",(allocator *)&local_2b0);
  std::locale::locale(local_5d8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_5d8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_5d8);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20f);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"15 o\'clock\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_5d0,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_5d0);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_5d0);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_62,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"15 o\'clock",(allocator *)&local_2b0);
  std::locale::locale(local_5c8,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_5c8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_5c8);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20f);
    poVar6 = std::operator<<(poVar6,
                             " (ss.str())==(to_correct_string<CharType>(\"15 o\'clock\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_cc0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_cc0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"15 o\'clock",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_5c0,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_5c0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_5c0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_cc0);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20f);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"15 o\'clock\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  format_string.field_2._8_8_ = 0x52c2b1c0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ad8);
  std::locale::~locale(local_ad8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'%Y\'}",
             (allocator *)local_290);
  std::locale::locale(local_5b8,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_5b8);
  std::locale::~locale(local_5b8);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_ca0,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_ca0);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_63,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_ca0);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"2013",(allocator *)&local_2b0);
  std::locale::locale(local_5b0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_5b0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_5b0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x214);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"2013\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_5a8,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_5a8);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_5a8);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_64,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"2013",(allocator *)&local_2b0);
  std::locale::locale(local_5a0,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_5a0);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_5a0);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x214);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"2013\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_c80,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_c80);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"2013",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_598,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_598);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_598);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c80);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x214);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"2013\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ad0);
  std::locale::~locale(local_ad0);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'%y\'}",
             (allocator *)local_290);
  std::locale::locale(local_590,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_590);
  std::locale::~locale(local_590);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_c60,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_c60);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_65,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c60);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"13",(allocator *)&local_2b0);
  std::locale::locale(local_588,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_588);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_588);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x215);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_580,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_580);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_580);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_66,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"13",(allocator *)&local_2b0);
  std::locale::locale(local_578,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_578);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_578);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x215);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"13\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_c40,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_c40);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"13",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_570,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_570);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_570);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c40);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x215);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"13\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar2 = error_counter + 1;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar2;
    bVar4 = 0x14 < error_counter;
    error_counter = uVar2;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&g);
  std::ios::imbue(local_ac8);
  std::locale::~locale(local_ac8);
  std::__cxx11::string::string
            ((string *)(fmt_21.field_2._M_local_buf + 8),"{1,gmt,ftime=\'%D\'}",
             (allocator *)local_290);
  std::locale::locale(local_568,(locale *)local_38);
  to_correct_string<char>((string *)local_210,(string *)((long)&fmt_21.field_2 + 8),local_568);
  std::locale::~locale(local_568);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_c20,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_c20);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_67,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c20);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"12/31/13",(allocator *)&local_2b0);
  std::locale::locale(local_560,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_560);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_560);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x216);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"12/31/13\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)local_290,"",(allocator *)&a_datetime);
  std::locale::locale(local_558,(locale *)local_38);
  to_correct_string<char>((string *)((long)&fmt_21.field_2 + 8),(string *)local_290,local_558);
  std::__cxx11::stringbuf::str((string *)&ss);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  std::locale::~locale(local_558);
  std::__cxx11::string::~string((string *)local_290);
  local_290._0_4_ = 0;
  fmt._M_dataplus._M_p = (pointer)local_210;
  fmt._M_string_length = 0;
  fmt.field_2._M_allocated_capacity = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  paVar9 = &local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  fmt.field_2._8_8_ = &local_260;
  local_230._M_p = (pointer)paVar9;
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),(message_type *)local_290);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::write(pbVar5,(int)&g,__buf_68,(size_t)paVar9);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  booster::locale::basic_message<char>::~basic_message((basic_message<char> *)local_290);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&a_datetime,"12/31/13",(allocator *)&local_2b0);
  std::locale::locale(local_550,(locale *)local_38);
  to_correct_string<char>((string *)local_290,(string *)&a_datetime,local_550);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (fmt_21.field_2._M_local_buf + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::locale::~locale(local_550);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::__cxx11::string::~string((string *)(fmt_21.field_2._M_local_buf + 8));
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x216);
    poVar6 = std::operator<<(poVar6," (ss.str())==(to_correct_string<CharType>(\"12/31/13\",loc))");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::string((string *)&local_c00,(string *)local_210);
  booster::locale::basic_format<char>::basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8),&local_c00);
  pbVar5 = booster::locale::basic_format<char>::operator%
                     ((basic_format<char> *)((long)&fmt_21.field_2 + 8),
                      (long *)(format_string.field_2._M_local_buf + 8));
  booster::locale::basic_format<char>::str_abi_cxx11_
            ((string_type *)local_290,pbVar5,(locale *)local_38);
  std::__cxx11::string::string
            ((string *)&local_2b0,"12/31/13",(allocator *)(format.field_2._M_local_buf + 0xf));
  std::locale::locale(local_548,(locale *)local_38);
  to_correct_string<char>((string *)&a_datetime,&local_2b0,local_548);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_290,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &a_datetime);
  std::__cxx11::string::~string((string *)&a_datetime);
  std::locale::~locale(local_548);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_290);
  booster::locale::basic_format<char>::~basic_format
            ((basic_format<char> *)((long)&fmt_21.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_c00);
  if (!_Var3) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x216);
    poVar6 = std::operator<<(poVar6,
                             " ((booster::locale::basic_format<CharType>(fmt) % a_datetime).str(loc))==(to_correct_string<CharType>(\"12/31/13\",loc))"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar1 = error_counter + 1;
    bVar4 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar4) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)(fmt_21.field_2._M_local_buf + 8),
                 "Error limits reached, stopping unit test",(allocator *)local_290);
      booster::runtime_error::runtime_error(prVar7,(string *)((long)&fmt_21.field_2 + 8));
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&g);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_60);
  std::locale::~locale((locale *)local_38);
  booster::locale::generator::~generator(local_540);
  return;
}

Assistant:

void test_format(std::string charset="UTF-8")
{
    booster::locale::generator g;
    std::locale loc=g("en_US."+charset);
    
    FORMAT("{3} {1} {2}", 1 % 2 % 3,"3 1 2");
    FORMAT("{1} {2}", "hello" % 2,"hello 2");
    FORMAT("{1}",1200.1,"1200.1");
    FORMAT("Test {1,num}",1200.1,"Test 1,200.1");
    FORMAT("{{}} {1,number}",1200.1,"{} 1,200.1");
    #if BOOSTER_ICU_VER < 5601 
    // bug #13276
    FORMAT("{1,num=sci,p=3}",13.1,"1.310E1");
    FORMAT("{1,num=scientific,p=3}",13.1,"1.310E1");
    #endif
    FORMAT("{1,num=fix,p=3}",13.1,"13.100");
    FORMAT("{1,num=fixed,p=3}",13.1,"13.100");
    FORMAT("{1,<,w=3,num}",-1,"-1 ");
    FORMAT("{1,>,w=3,num}",1,"  1");
    FORMAT("{per,1}",0.1,"10%");
    FORMAT("{percent,1}",0.1,"10%");
    FORMAT("{1,cur}",1234,"$1,234.00");
    FORMAT("{1,currency}",1234,"$1,234.00");
    if(charset=="UTF-8") {
        if(U_ICU_VERSION_MAJOR_NUM >=4)
            FORMAT("{1,cur,locale=de_DE}",10,"10,00\xC2\xA0€");
        else
            FORMAT("{1,cur,locale=de_DE}",10,"10,00 €");
    }
    #if BOOSTER_ICU_VER >= 402
    FORMAT("{1,cur=nat}",1234,"$1,234.00");
    FORMAT("{1,cur=national}",1234,"$1,234.00");
    FORMAT("{1,cur=iso}",1234,"USD1,234.00");
    #endif
    FORMAT("{1,spell}",10,"ten");
    FORMAT("{1,spellout}",10,"ten");
    #if 402 <= BOOSTER_ICU_VER && BOOSTER_ICU_VER < 408
    if(charset=="UTF-8") {
        FORMAT("{1,ord}",1,"1\xcb\xa2\xe1\xb5\x97");
        FORMAT("{1,ordinal}",1,"1\xcb\xa2\xe1\xb5\x97");
    }
    #else
    FORMAT("{1,ord}",1,"1st");
    FORMAT("{1,ordinal}",1,"1st");
    #endif

    time_t now=time(0);
    time_t lnow = now + 3600 * 4;
    char local_time_str[256];
    std::string format="'%H:%M:%S'";
    std::basic_string<CharType> format_string(format.begin(),format.end());
    strftime(local_time_str,sizeof(local_time_str),format.c_str(),gmtime(&lnow));

    FORMAT("{1,ftime='''%H:%M:%S'''}",now,local_time_str);
    FORMAT("{1,local,ftime='''%H:%M:%S'''}",now,local_time_str);
    FORMAT("{1,ftime='''%H:%M:%S'''}",now,local_time_str);

    time_t a_date = 3600*24*(31+4); // Feb 5th
    time_t a_time = 3600*15+60*33; // 15:33:05
    time_t a_timesec = 13;
    time_t a_datetime = a_date + a_time + a_timesec;
    FORMAT("{1,date,gmt};{1,time,gmt};{1,datetime,gmt};{1,dt,gmt}",a_datetime,
            "Feb 5, 1970;3:33:13 PM;Feb 5, 1970" PERIOD " 3:33:13 PM;Feb 5, 1970" PERIOD " 3:33:13 PM");
    #if BOOSTER_ICU_VER >= 408
    FORMAT("{1,time=short,gmt};{1,time=medium,gmt};{1,time=long,gmt};{1,date=full,gmt}",a_datetime,
            "3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970");
    FORMAT("{1,time=s,gmt};{1,time=m,gmt};{1,time=l,gmt};{1,date=f,gmt}",a_datetime,
            "3:33 PM;3:33:13 PM;3:33:13 PM GMT;Thursday, February 5, 1970");
    #else
    FORMAT("{1,time=short,gmt};{1,time=medium,gmt};{1,time=long,gmt};{1,date=full,gmt}",a_datetime,
            "3:33 PM;3:33:13 PM;3:33:13 PM GMT+00:00;Thursday, February 5, 1970");
    FORMAT("{1,time=s,gmt};{1,time=m,gmt};{1,time=l,gmt};{1,date=f,gmt}",a_datetime,
            "3:33 PM;3:33:13 PM;3:33:13 PM GMT+00:00;Thursday, February 5, 1970");
    #endif
    FORMAT("{1,time=s,tz=GMT+01:00}",a_datetime,"4:33 PM");
    FORMAT("{1,time=s,timezone=GMT+01:00}",a_datetime,"4:33 PM");

    FORMAT("{1,gmt,ftime='%H'''}",a_datetime,"15'");
    FORMAT("{1,gmt,ftime='''%H'}",a_datetime,"'15");
    FORMAT("{1,gmt,ftime='%H o''clock'}",a_datetime,"15 o'clock");

    // Test not a year of the week
    a_datetime=1388491200; // 2013-12-31 12:00 - check we don't use week of year

    FORMAT("{1,gmt,ftime='%Y'}",a_datetime,"2013");
    FORMAT("{1,gmt,ftime='%y'}",a_datetime,"13");
    FORMAT("{1,gmt,ftime='%D'}",a_datetime,"12/31/13");
}